

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_gcc_atomic.hpp
# Opt level: O0

uint_least32_t boost::detail::atomic_conditional_increment(uint_least32_t *pw)

{
  uint_least32_t uVar1;
  bool bVar2;
  uint_least32_t r;
  uint_least32_t *pw_local;
  
  uVar1 = *pw;
  do {
    r = uVar1;
    if (r == 0) {
      return 0;
    }
    LOCK();
    uVar1 = *pw;
    bVar2 = r == uVar1;
    if (bVar2) {
      *pw = r + 1;
      uVar1 = r;
    }
    UNLOCK();
  } while (!bVar2);
  return r;
}

Assistant:

inline boost::uint_least32_t atomic_conditional_increment( boost::uint_least32_t * pw )
{
    // long r = *pw;
    // if( r != 0 ) ++*pw;
    // return r;

    boost::uint_least32_t r = __atomic_load_n( pw, __ATOMIC_RELAXED );

    for( ;; )
    {
        if( r == 0 )
        {
            return r;
        }

        if( __atomic_compare_exchange_n( pw, &r, r + 1, true, __ATOMIC_RELAXED, __ATOMIC_RELAXED ) )
        {
            return r;
        }
    }
}